

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverAppTest_StandardOptions_Test::SolverAppTest_StandardOptions_Test
          (SolverAppTest_StandardOptions_Test *this)

{
  undefined8 *in_RDI;
  SolverAppTest *unaff_retaddr;
  
  SolverAppTest::SolverAppTest(unaff_retaddr);
  *in_RDI = &PTR__SolverAppTest_StandardOptions_Test_00399410;
  return;
}

Assistant:

TEST_F(SolverAppTest, StandardOptions) {
  mp::OptionList &options = app_.options();
  options.Sort();
  char std_options[] = {'-', '=', '?', 'e', 's', 'v'};
  for (std::size_t i = 0, n = sizeof(std_options); i < n; ++i) {
    char opt = std_options[i];
    EXPECT_TRUE(options.Find(opt) != 0) << "option -" << opt;
  }
}